

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Debugger.cpp
# Opt level: O0

JsValueRef
Debugger::GetStackProperties
          (JsValueRef callee,bool isConstructCall,JsValueRef *arguments,unsigned_short argumentCount
          ,void *callbackState)

{
  JsErrorCode JVar1;
  PAL_FILE *pPVar2;
  LPCWSTR pWVar3;
  JsErrorCode jsErrorCode_1;
  JsErrorCode jsErrorCode;
  int stackFrameIndex;
  JsValueRef properties;
  void *callbackState_local;
  JsValueRef *ppvStack_28;
  unsigned_short argumentCount_local;
  JsValueRef *arguments_local;
  JsValueRef pvStack_18;
  bool isConstructCall_local;
  JsValueRef callee_local;
  
  _jsErrorCode = (JsValueRef)0x0;
  if (1 < argumentCount) {
    properties = callbackState;
    callbackState_local._6_2_ = argumentCount;
    ppvStack_28 = arguments;
    arguments_local._7_1_ = isConstructCall;
    pvStack_18 = callee;
    JVar1 = ChakraRTInterface::JsNumberToInt(arguments[1],(int *)&jsErrorCode_1);
    if (JVar1 != JsNoError) {
      pPVar2 = PAL_get_stderr(0);
      pWVar3 = Helpers::JsErrorCodeToString(JVar1);
      PAL_fwprintf(pPVar2,
                   L"ERROR: ChakraRTInterface::JsNumberToInt(arguments[1], &stackFrameIndex) failed. JsErrorCode=0x%x (%s)\n"
                   ,(ulong)JVar1,pWVar3);
      pPVar2 = PAL_get_stderr(0);
      PAL_fflush(pPVar2);
      return (JsValueRef)0x0;
    }
    JVar1 = ChakraRTInterface::JsDiagGetStackProperties(jsErrorCode_1,(JsValueRef *)&jsErrorCode);
    if (JVar1 != JsNoError) {
      pPVar2 = PAL_get_stderr(0);
      pWVar3 = Helpers::JsErrorCodeToString(JVar1);
      PAL_fwprintf(pPVar2,
                   L"ERROR: ChakraRTInterface::JsDiagGetStackProperties(stackFrameIndex, &properties) failed. JsErrorCode=0x%x (%s)\n"
                   ,(ulong)JVar1,pWVar3);
      pPVar2 = PAL_get_stderr(0);
      PAL_fflush(pPVar2);
      return (JsValueRef)0x0;
    }
  }
  return _jsErrorCode;
}

Assistant:

JsValueRef Debugger::GetStackProperties(JsValueRef callee, bool isConstructCall, JsValueRef *arguments, unsigned short argumentCount, void *callbackState)
{
    JsValueRef properties = JS_INVALID_REFERENCE;
    int stackFrameIndex;

    if (argumentCount > 1)
    {
        IfJsErrorFailLogAndRet(ChakraRTInterface::JsNumberToInt(arguments[1], &stackFrameIndex));
        IfJsErrorFailLogAndRet(ChakraRTInterface::JsDiagGetStackProperties(stackFrameIndex, &properties));
    }

    return properties;
}